

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O1

bool __thiscall zmq::zmtp_engine_t::handshake_v3_x(zmtp_engine_t *this,bool downgrade_sub_)

{
  options_t *options_;
  int iVar1;
  socket_base_t *this_00;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  plain_client_t *this_01;
  null_mechanism_t *this_02;
  mechanism_t *pmVar2;
  zmtp_engine_t *this_03;
  
  options_ = &(this->super_stream_engine_base_t)._options;
  iVar1 = (this->super_stream_engine_base_t)._options.mechanism;
  if (iVar1 == 1) {
    if ((*(int *)(this->_greeting_recv + 0x1c) != 0 ||
        *(long *)(this->_greeting_recv + 0xc) != 0x4e49414c50) ||
        *(long *)(this->_greeting_recv + 0x14) != 0) goto LAB_001fa7b9;
    if ((this->super_stream_engine_base_t)._options.as_server == 0) {
      this_01 = (plain_client_t *)operator_new(0x5a0,(nothrow_t *)&std::nothrow);
      if (this_01 == (plain_client_t *)0x0) {
        this_01 = (plain_client_t *)0x0;
      }
      else {
        plain_client_t::plain_client_t(this_01,(this->super_stream_engine_base_t)._session,options_)
        ;
      }
    }
    else {
      this_01 = (plain_client_t *)operator_new(0x5e8,(nothrow_t *)&std::nothrow);
      if (this_01 == (plain_client_t *)0x0) {
        this_01 = (plain_client_t *)0x0;
      }
      else {
        plain_server_t::plain_server_t
                  ((plain_server_t *)this_01,(this->super_stream_engine_base_t)._session,
                   &(this->super_stream_engine_base_t)._peer_address,options_);
      }
      if (this_01 != (plain_client_t *)0x0) {
        this_01 = (plain_client_t *)
                  &(((zap_client_common_handshake_t *)&this_01->super_mechanism_base_t)->
                   super_zap_client_t).field_0x50;
      }
    }
    (this->super_stream_engine_base_t)._mechanism = (mechanism_t *)this_01;
    if (this_01 != (plain_client_t *)0x0) goto LAB_001fa8ce;
    this_03 = (zmtp_engine_t *)0x16c;
  }
  else {
    if ((iVar1 != 0) ||
       ((*(int *)(this->_greeting_recv + 0x1c) != 0 ||
        *(long *)(this->_greeting_recv + 0xc) != 0x4c4c554e) ||
        *(long *)(this->_greeting_recv + 0x14) != 0)) {
LAB_001fa7b9:
      this_00 = (this->super_stream_engine_base_t)._socket;
      endpoint_uri_pair_ = session_base_t::get_endpoint((this->super_stream_engine_base_t)._session)
      ;
      socket_base_t::event_handshake_failed_protocol(this_00,endpoint_uri_pair_,0x11000002);
      stream_engine_base_t::error(&this->super_stream_engine_base_t,protocol_error);
      return false;
    }
    this_02 = (null_mechanism_t *)operator_new(0x5e8,(nothrow_t *)&std::nothrow);
    if (this_02 == (null_mechanism_t *)0x0) {
      this_02 = (null_mechanism_t *)0x0;
    }
    else {
      null_mechanism_t::null_mechanism_t
                (this_02,(this->super_stream_engine_base_t)._session,
                 &(this->super_stream_engine_base_t)._peer_address,options_);
    }
    pmVar2 = (mechanism_t *)&(this_02->super_zap_client_t).field_0x50;
    if (this_02 == (null_mechanism_t *)0x0) {
      pmVar2 = (mechanism_t *)0x0;
    }
    (this->super_stream_engine_base_t)._mechanism = pmVar2;
    if (this_02 != (null_mechanism_t *)0x0) goto LAB_001fa8ce;
    this_03 = (zmtp_engine_t *)0x161;
  }
  handshake_v3_x(this_03);
LAB_001fa8ce:
  (this->super_stream_engine_base_t)._next_msg =
       (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::next_handshake_command;
  *(undefined8 *)&(this->super_stream_engine_base_t).field_0x550 = 0;
  (this->super_stream_engine_base_t)._process_msg =
       (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::process_handshake_command;
  *(undefined8 *)&(this->super_stream_engine_base_t).field_0x560 = 0;
  return true;
}

Assistant:

bool zmq::zmtp_engine_t::handshake_v3_x (const bool downgrade_sub_)
{
    if (_options.mechanism == ZMQ_NULL
        && memcmp (_greeting_recv + 12, "NULL\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0",
                   20)
             == 0) {
        _mechanism = new (std::nothrow)
          null_mechanism_t (session (), _peer_address, _options);
        alloc_assert (_mechanism);
    } else if (_options.mechanism == ZMQ_PLAIN
               && memcmp (_greeting_recv + 12,
                          "PLAIN\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                    == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow)
              plain_server_t (session (), _peer_address, _options);
        else
            _mechanism =
              new (std::nothrow) plain_client_t (session (), _options);
        alloc_assert (_mechanism);
    }
#ifdef ZMQ_HAVE_CURVE
    else if (_options.mechanism == ZMQ_CURVE
             && memcmp (_greeting_recv + 12,
                        "CURVE\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                  == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow) curve_server_t (
              session (), _peer_address, _options, downgrade_sub_);
        else
            _mechanism = new (std::nothrow)
              curve_client_t (session (), _options, downgrade_sub_);
        alloc_assert (_mechanism);
    }
#endif
#ifdef HAVE_LIBGSSAPI_KRB5
    else if (_options.mechanism == ZMQ_GSSAPI
             && memcmp (_greeting_recv + 12,
                        "GSSAPI\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                  == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow)
              gssapi_server_t (session (), _peer_address, _options);
        else
            _mechanism =
              new (std::nothrow) gssapi_client_t (session (), _options);
        alloc_assert (_mechanism);
    }
#endif
    else {
        socket ()->event_handshake_failed_protocol (
          session ()->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MECHANISM_MISMATCH);
        error (protocol_error);
        return false;
    }